

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

void __thiscall Clasp::mt::SharedLitsClause::toLits(SharedLitsClause *this,LitVec *out)

{
  SharedLiterals *pSVar1;
  Memcpy<Clasp::Literal> local_8;
  
  pSVar1 = (this->super_ClauseHead).field_0.shared_;
  local_8.first_ = (Literal *)(pSVar1 + 1);
  bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
  insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
            ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)out,
             (out->ebo_).buf + (out->ebo_).size,pSVar1->size_type_ >> 2,&local_8);
  return;
}

Assistant:

void SharedLitsClause::toLits(LitVec& out) const {
	out.insert(out.end(), shared_->begin(), shared_->end());
}